

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Command::raiseError(Command *this,string *message)

{
  ostream *poVar1;
  ostringstream *this_00;
  domain_error *this_01;
  char *pcVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  string asStack_1c8 [32];
  ostringstream oss;
  
  this_00 = (ostringstream *)&oss;
  std::__cxx11::ostringstream::ostringstream(this_00);
  if ((this->m_name)._M_string_length == 0) {
    poVar1 = std::operator<<((ostream *)&oss,"Error while parsing ");
    this_00 = (ostringstream *)std::operator<<(poVar1,(string *)this);
    pcVar2 = ". ";
  }
  else {
    pcVar2 = "Error while parsing arguments. ";
  }
  poVar1 = std::operator<<((ostream *)this_00,pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1,".");
  if ((this->m_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::operator<<((ostream *)&oss," Arguments were:");
  }
  lVar3 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(this->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    poVar1 = std::operator<<((ostream *)&oss," ");
    std::operator<<(poVar1,(string *)
                           ((long)&(((this->m_args).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar3));
    lVar3 = lVar3 + 0x20;
  }
  this_01 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_01,asStack_1c8);
  __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

CATCH_ATTRIBUTE_NORETURN
        void raiseError( const std::string& message ) const {
            std::ostringstream oss;
            if( m_name.empty() )
                oss << "Error while parsing " << m_name << ". " << message << ".";
            else
                oss << "Error while parsing arguments. " << message << ".";

            if( m_args.size() > 0 )
                oss << " Arguments were:";
            for( std::size_t i = 0; i < m_args.size(); ++i )
                oss << " " << m_args[i];
            throw std::domain_error( oss.str() );
        }